

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var1;
  reference pvVar2;
  pointer pEVar3;
  reference pvVar4;
  CastFunctionSet *this_00;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  size_type __n;
  size_type __n_00;
  LogicalType by_type;
  LogicalType decimal_type;
  vector<duckdb::LogicalType,_true> by_types;
  type name;
  LogicalType local_1d0;
  LogicalType local_1b8;
  vector<duckdb::LogicalType,_true> local_1a0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_188;
  size_type *local_180;
  LogicalType *local_178;
  size_type local_170;
  undefined8 uStack_168;
  AggregateFunction local_160;
  
  local_188._M_head_impl = (FunctionData *)this;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  LogicalType::LogicalType(&local_1b8,&pEVar3->return_type);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  LogicalType::LogicalType(&local_1d0,&pEVar3->return_type);
  ArgMaxByTypes();
  if (local_1a0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1a0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0xffffffffffffffff;
    __n_00 = 0;
    do {
      pvVar4 = vector<duckdb::LogicalType,_true>::operator[](&local_1a0,__n_00);
      if (pvVar4->physical_type_ == local_1d0.physical_type_) goto LAB_0193896d;
      this_00 = CastFunctionSet::Get(context);
      pvVar4 = vector<duckdb::LogicalType,_true>::operator[](&local_1a0,__n_00);
      uVar5 = CastFunctionSet::ImplicitCastCost(this_00,&local_1d0,pvVar4);
      sVar7 = __n;
      if (uVar5 < 0x7fffffffffffffff) {
        sVar7 = __n_00;
      }
      if (-1 < (long)uVar5) {
        __n = sVar7;
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)local_1a0.
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1a0.
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
    if (__n != 0xffffffffffffffff) {
      pvVar4 = vector<duckdb::LogicalType,_true>::operator[](&local_1a0,__n);
      if (&local_1d0 != pvVar4) {
        local_1d0.id_ = pvVar4->id_;
        local_1d0.physical_type_ = pvVar4->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&local_1d0.type_info_,&pvVar4->type_info_);
      }
    }
  }
LAB_0193896d:
  local_180 = (size_type *)
              (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
  paVar6 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180 == paVar6) {
    local_170 = paVar6->_M_allocated_capacity;
    uStack_168 = *(undefined8 *)
                  ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.
                          name.field_2 + 8);
    local_180 = &local_170;
  }
  else {
    local_170 = paVar6->_M_allocated_capacity;
  }
  local_178 = (LogicalType *)
              (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
              _M_string_length;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)paVar6;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_string_length = 0
  ;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2._M_local_buf
  [0] = '\0';
  if (local_1b8.physical_type_ == INT64) {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,long>
              (&local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  else if (local_1b8.physical_type_ == INT32) {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,int>
              (&local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  else if (local_1b8.physical_type_ == INT16) {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,short>
              (&local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  else {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>,duckdb::hugeint_t>
              (&local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  AggregateFunction::operator=(function,&local_160);
  local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02433f70;
  if (local_160.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
  ::std::__cxx11::string::operator=
            ((string *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,
             (string *)&local_180);
  if (&(function->super_BaseScalarFunction).return_type != &local_1b8) {
    (function->super_BaseScalarFunction).return_type.id_ = local_1b8.id_;
    (function->super_BaseScalarFunction).return_type.physical_type_ = local_1b8.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(function->super_BaseScalarFunction).return_type.type_info_,&local_1b8.type_info_);
  }
  _Var1._M_head_impl = local_188._M_head_impl;
  (local_188._M_head_impl)->_vptr_FunctionData = (_func_int **)0x0;
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1a0);
  LogicalType::~LogicalType(&local_1d0);
  LogicalType::~LogicalType(&local_1b8);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var1._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> BindDecimalArgMinMax(ClientContext &context, AggregateFunction &function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto by_type = arguments[1]->return_type;

	// To avoid a combinatorial explosion, cast the ordering argument to one from the list
	auto by_types = ArgMaxByTypes();
	idx_t best_target = DConstants::INVALID_INDEX;
	int64_t lowest_cost = NumericLimits<int64_t>::Maximum();
	for (idx_t i = 0; i < by_types.size(); ++i) {
		// Before falling back to casting, check for a physical type match for the by_type
		if (by_types[i].InternalType() == by_type.InternalType()) {
			lowest_cost = 0;
			best_target = DConstants::INVALID_INDEX;
			break;
		}

		auto cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(by_type, by_types[i]);
		if (cast_cost < 0) {
			continue;
		}
		if (cast_cost < lowest_cost) {
			best_target = i;
		}
	}

	if (best_target != DConstants::INVALID_INDEX) {
		by_type = by_types[best_target];
	}

	auto name = std::move(function.name);
	function = GetDecimalArgMinMaxFunction<OP>(by_type, decimal_type);
	function.name = std::move(name);
	function.return_type = decimal_type;
	return nullptr;
}